

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

Template * StringToTemplateWithAutoEscaping(string *s,Strip strip,TemplateContext context)

{
  Template *pTVar1;
  ctemplate local_a8 [32];
  TemplateString local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string text;
  TemplateContext context_local;
  Strip strip_local;
  string *s_local;
  
  GetPragmaForContext_abi_cxx11_((TemplateContext)local_58);
  std::operator+(local_38,local_58);
  std::__cxx11::string::~string((string *)local_58);
  ctemplate::StringToTemplateFile(local_a8,local_38);
  ctemplate::TemplateString::TemplateString(&local_88,(string *)local_a8);
  pTVar1 = (Template *)ctemplate::Template::GetTemplate(&local_88,strip);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_38);
  return pTVar1;
}

Assistant:

static Template* StringToTemplateWithAutoEscaping(const string& s,
                                                  Strip strip,
                                                  TemplateContext context) {
  string text = GetPragmaForContext(context) + s;
  return Template::GetTemplate(StringToTemplateFile(text), strip);
}